

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O1

Name wasm::Names::getValidLocalName(Function *func,Name root)

{
  size_t sVar1;
  string *in_R9;
  IString IVar2;
  Name root_00;
  long *local_68 [2];
  long local_58 [2];
  Function *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  uStack_40 = 0;
  pcStack_30 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:121:5)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:121:5)>
             ::_M_manager;
  local_48 = func;
  sVar1 = Function::getNumLocals(func);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"_","");
  root_00.super_IString.str._M_str = (char *)&local_48;
  root_00.super_IString.str._M_len = (size_t)root.super_IString.str._M_str;
  IVar2.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)(sVar1 & 0xffffffff),(Index)local_68,in_R9
                          );
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (IString)(IString)IVar2.str;
}

Assistant:

inline Name getValidLocalName(Function& func, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !func.hasLocalIndex(test); },
    func.getNumLocals());
}